

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O3

void __thiscall
Hpipe::InstructionClrStr::write_cpp_code_seq
          (InstructionClrStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter,
          string repl_data,string repl_buf)

{
  ostream *poVar1;
  StreamSep local_58;
  
  StreamSepMaker::operator<<(&local_58,ss,(char (*) [12])0x17c6ca);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_58.stream,local_58.sep._M_dataplus._M_p,local_58.sep._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
  StreamSep::operator<<(&local_58,(char (*) [10])".clear();");
  StreamSep::~StreamSep(&local_58);
  return;
}

Assistant:

void InstructionClrStr::write_cpp_code_seq( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter, std::string repl_data, std::string repl_buf ) {
    ss << "HPIPE_DATA." << var << ".clear();";
}